

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s,int r,int N)

{
  int iVar1;
  auto_arima_object paVar2;
  int local_4c;
  int ncxreg;
  int i;
  int Qmax;
  int Dmax;
  int Pmax;
  int qmax;
  int dmax;
  int pmax;
  auto_arima_object obj;
  int N_local;
  int r_local;
  int s_local;
  int *PDQmax_local;
  int *pdqmax_local;
  
  if (pdqmax == (int *)0x0) {
    qmax = 5;
    Pmax = 2;
    Dmax = 5;
  }
  else {
    qmax = *pdqmax;
    Pmax = pdqmax[1];
    Dmax = pdqmax[2];
  }
  if (PDQmax == (int *)0x0) {
    Qmax = 2;
    i = 1;
    ncxreg = 2;
  }
  else {
    Qmax = *PDQmax;
    i = PDQmax[1];
    ncxreg = PDQmax[2];
  }
  iVar1 = r + 2;
  if ((((-1 < qmax) && (-1 < Pmax)) && (-1 < Dmax)) &&
     (((0 < N && (-1 < Qmax)) && ((-1 < i && (-1 < ncxreg)))))) {
    paVar2 = (auto_arima_object)
             malloc((long)(qmax + Dmax + Qmax + ncxreg + iVar1 + N) * 8 + 0x150 +
                    (long)(qmax + Dmax + Qmax + ncxreg + iVar1) * 8 *
                    (long)(qmax + Dmax + Qmax + ncxreg + iVar1));
    paVar2->pmax = qmax;
    paVar2->dmax = Pmax;
    paVar2->qmax = Dmax;
    paVar2->N = N;
    paVar2->s = s;
    paVar2->Pmax = Qmax;
    paVar2->Dmax = i;
    paVar2->Qmax = ncxreg;
    paVar2->M = iVar1;
    paVar2->r = r;
    paVar2->retval = 0;
    paVar2->start = 0;
    paVar2->verbose = 0;
    for (local_4c = 0;
        local_4c <
        qmax + Dmax + Qmax + ncxreg + iVar1 + N +
        (qmax + Dmax + Qmax + ncxreg + iVar1) * (qmax + Dmax + Qmax + ncxreg + iVar1);
        local_4c = local_4c + 1) {
      *(undefined8 *)(&paVar2[1].N + (long)local_4c * 2) = 0;
    }
    paVar2->phi = (double *)(paVar2 + 1);
    paVar2->theta = (double *)(&paVar2[1].N + (long)qmax * 2);
    paVar2->PHI = (double *)(&paVar2[1].N + (long)(qmax + Dmax) * 2);
    paVar2->THETA = (double *)(&paVar2[1].N + (long)(qmax + Dmax + Qmax) * 2);
    paVar2->exog = (double *)(&paVar2[1].N + (long)(qmax + Dmax + Qmax + ncxreg) * 2);
    paVar2->res = (double *)(&paVar2[1].N + (long)(qmax + Dmax + Qmax + ncxreg + iVar1) * 2);
    paVar2->vcov = (double *)(&paVar2[1].N + (long)(qmax + Dmax + Qmax + ncxreg + iVar1 + N) * 2);
    paVar2->method = 0;
    paVar2->optmethod = 5;
    paVar2->mean = 0.0;
    paVar2->var = 1.0;
    paVar2->lvcov = (qmax + Dmax + Qmax + ncxreg + iVar1) * (qmax + Dmax + Qmax + ncxreg + iVar1);
    paVar2->ncoeff = qmax + Dmax + Qmax + ncxreg + iVar1;
    paVar2->stepwise = 1;
    paVar2->stationary = 0;
    paVar2->approximation = (uint)(0x96 < N || 0xc < s);
    paVar2->Order_max = 5;
    paVar2->seasonal = 1;
    paVar2->num_models = 0x5e;
    paVar2->alpha_test = 0.05;
    paVar2->alpha_seas = 0.05;
    paVar2->imean = 1;
    paVar2->idrift = 1;
    strcpy(paVar2->test,"kpss");
    strcpy(paVar2->seas,"seas");
    strcpy(paVar2->information_criteria,"aicc");
    strcpy(paVar2->type,"level");
    paVar2->p_start = 2;
    paVar2->q_start = 2;
    paVar2->P_start = 1;
    paVar2->Q_start = 1;
    paVar2->Q = 0;
    paVar2->D = 0;
    paVar2->P = 0;
    paVar2->q = 0;
    paVar2->d = 0;
    paVar2->p = 0;
    paVar2->aicc = 0.0;
    paVar2->bic = 0.0;
    paVar2->aic = 0.0;
    return paVar2;
  }
  printf("\n Input Values cannot be Negative. Program Exiting. \n");
  exit(-1);
}

Assistant:

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s, int r, int N) {
	auto_arima_object obj = NULL;
	int pmax,dmax,qmax,Pmax,Dmax,Qmax;
	int i,ncxreg;

	if (pdqmax == NULL) {
		pmax = 5;
		dmax = 2;
		qmax = 5;
	} else {
		pmax = pdqmax[0];
		dmax = pdqmax[1];
		qmax = pdqmax[2];
	}

	if (PDQmax == NULL) {
		Pmax = 2;
		Dmax = 1;
		Qmax = 2;
	} else {
		Pmax = PDQmax[0];
		Dmax = PDQmax[1];
		Qmax = PDQmax[2];
	}

	ncxreg = r + 2;
	if (pmax < 0 || dmax < 0 || qmax < 0 || N <= 0 || Pmax < 0 || Dmax < 0 || Qmax < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	obj = (auto_arima_object)malloc(sizeof(struct auto_arima_set) +
	 sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg + N) + sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ));

	obj->pmax = pmax;
	obj->dmax = dmax;
	obj->qmax = qmax;
	obj->N = N;
	obj->s = s;
	obj->Pmax = Pmax;
	obj->Dmax = Dmax;
	obj->Qmax = Qmax;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->verbose = 0;

	for(i = 0; i < (pmax + qmax + Pmax + Qmax + ncxreg + N) + (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ); ++i ) {
		obj->params[i] = 0.0;
	}

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[pmax];
	obj->PHI = &obj->params[pmax + qmax];
	obj->THETA = &obj->params[pmax + qmax + Pmax];
	obj->exog = &obj->params[pmax + qmax + Pmax + Qmax];
	obj->res = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg];
	obj->vcov = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg + N];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg );
	obj->ncoeff = pmax + qmax + Pmax + Qmax + ncxreg ;

	// Set Default Values

	obj->stepwise = 1;
	obj->stationary = 0;
	obj->approximation = (N > 150 || s >  12) ? 1 : 0;
	//obj->approximation = 0;
	obj->Order_max = 5;
	obj->seasonal = 1;
	obj->num_models = 94;
	obj->alpha_test = 0.05;
	obj->alpha_seas = 0.05;
	obj->imean = 1;
	obj->idrift = 1;

	strcpy(obj->test,"kpss");
	strcpy(obj->seas,"seas");
	strcpy(obj->information_criteria,"aicc");
	strcpy(obj->type,"level");

	obj->p_start = 2;
	obj->q_start = 2;
	obj->P_start = 1;
	obj->Q_start = 1;
	
	// Temporary Init
	
	obj->p = obj->d = obj->q = obj->P = obj->D = obj->Q = 0;
	obj->aic = obj->bic = obj->aicc = 0;


	return obj;
}